

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseXMLParser.cpp
# Opt level: O3

bool __thiscall Rml::BaseXMLParser::PeekString(BaseXMLParser *this,char *string,bool consume)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  bool bVar4;
  byte bVar5;
  bool bVar6;
  ulong uVar7;
  int iVar8;
  byte *pbVar9;
  
  uVar2 = this->xml_index;
  iVar1 = this->line_number;
  if (*string != '\0') {
    iVar8 = 0;
    uVar7 = uVar2;
    pbVar9 = (byte *)string;
    do {
      if ((this->xml_source)._M_string_length <= uVar7) {
LAB_001e1c69:
        bVar4 = false;
        goto LAB_001e1c6b;
      }
      bVar5 = Look(this);
      if (bVar5 == 10) {
        this->line_number = this->line_number + 1;
      }
      if (((iVar8 != 0) || (0x20 < bVar5)) ||
         (iVar3 = 0, (0x100002600U >> ((ulong)bVar5 & 0x3f) & 1) == 0)) {
        if (bVar5 != *pbVar9) goto LAB_001e1c69;
        iVar3 = iVar8 + 1;
      }
      iVar8 = iVar3;
      uVar7 = this->xml_index + 1;
      this->xml_index = uVar7;
      pbVar9 = (byte *)(string + iVar8);
    } while (string[iVar8] != '\0');
  }
  bVar6 = true;
  bVar4 = true;
  if (!consume) {
LAB_001e1c6b:
    bVar6 = bVar4;
    this->xml_index = uVar2;
    this->line_number = iVar1;
  }
  return bVar6;
}

Assistant:

bool BaseXMLParser::PeekString(const char* string, bool consume)
{
	const size_t start_index = xml_index;
	const int start_line = line_number;
	bool success = true;
	int i = 0;
	while (string[i])
	{
		if (AtEnd())
		{
			success = false;
			break;
		}

		const char c = Look();

		// Count line numbers
		if (c == '\n')
		{
			line_number++;
		}

		// Seek past all the whitespace if we haven't hit the initial character yet.
		if (i == 0 && StringUtilities::IsWhitespace(c))
		{
			Next();
		}
		else
		{
			if (c != string[i])
			{
				success = false;
				break;
			}

			i++;
			Next();
		}
	}

	// Set the index to the start index unless we are consuming.
	if (!consume || !success)
	{
		xml_index = start_index;
		line_number = start_line;
	}

	return success;
}